

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
cmFileCommand::HandleReadElfCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  bool bVar2;
  StringEntry *pSVar3;
  ostream *poVar4;
  size_type sVar5;
  string rpath;
  cmCommandArgumentGroup group;
  cmCommandArgumentsHelper argHelper;
  cmCAString fileNameArg;
  cmCAString runpathArg;
  cmCAString rpathArg;
  cmCAString readArg;
  cmELF elf;
  cmCAString errorArg;
  string local_448;
  cmCommandArgumentGroup local_428;
  cmCommandArgumentsHelper local_408;
  cmCAString local_3e8;
  cmCAString local_370;
  cmCAString local_2f8;
  cmCAString local_280;
  undefined1 local_208 [112];
  ios_base local_198 [264];
  cmCAString local_90;
  
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x80) {
    local_208._0_8_ = local_208 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_208,
               "READ_ELF must be called with at least three additional arguments.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_208);
    if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
      operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
    }
    bVar2 = false;
  }
  else {
    local_408.Arguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_408.Arguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_408.Arguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_428.ContainedArguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_428.ContainedArguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_428.ContainedArguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    cmCAString::cmCAString(&local_280,&local_408,"READ_ELF",(cmCommandArgumentGroup *)0x0);
    cmCAString::cmCAString(&local_3e8,&local_408,(char *)0x0,(cmCommandArgumentGroup *)0x0);
    cmCAString::cmCAString(&local_2f8,&local_408,"RPATH",&local_428);
    cmCAString::cmCAString(&local_370,&local_408,"RUNPATH",&local_428);
    cmCAString::cmCAString(&local_90,&local_408,"CAPTURE_ERROR",&local_428);
    cmCommandArgument::Follows(&local_280.super_cmCommandArgument,(cmCommandArgument *)0x0);
    cmCommandArgument::Follows
              (&local_3e8.super_cmCommandArgument,&local_280.super_cmCommandArgument);
    cmCommandArgumentGroup::Follows(&local_428,&local_3e8.super_cmCommandArgument);
    cmCommandArgumentsHelper::Parse
              (&local_408,args,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0);
    bVar2 = cmsys::SystemTools::FileExists(&local_3e8.String,true);
    if (bVar2) {
      cmELF::cmELF((cmELF *)local_208,local_3e8.String._M_dataplus._M_p);
      if ((local_2f8.String._M_string_length != 0) &&
         (pSVar3 = cmELF::GetRPath((cmELF *)local_208), pSVar3 != (StringEntry *)0x0)) {
        pcVar1 = (pSVar3->Value)._M_dataplus._M_p;
        local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_448,pcVar1,pcVar1 + (pSVar3->Value)._M_string_length);
        if (local_448._M_string_length != 0) {
          sVar5 = 0;
          do {
            if (local_448._M_dataplus._M_p[sVar5] == ':') {
              local_448._M_dataplus._M_p[sVar5] = ';';
            }
            sVar5 = sVar5 + 1;
          } while (local_448._M_string_length != sVar5);
        }
        cmMakefile::AddDefinition
                  ((this->super_cmCommand).Makefile,&local_2f8.String,local_448._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_448._M_dataplus._M_p != &local_448.field_2) {
          operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
        }
      }
      if ((local_370.String._M_string_length != 0) &&
         (pSVar3 = cmELF::GetRunPath((cmELF *)local_208), pSVar3 != (StringEntry *)0x0)) {
        pcVar1 = (pSVar3->Value)._M_dataplus._M_p;
        local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_448,pcVar1,pcVar1 + (pSVar3->Value)._M_string_length);
        if (local_448._M_string_length != 0) {
          sVar5 = 0;
          do {
            if (local_448._M_dataplus._M_p[sVar5] == ':') {
              local_448._M_dataplus._M_p[sVar5] = ';';
            }
            sVar5 = sVar5 + 1;
          } while (local_448._M_string_length != sVar5);
        }
        cmMakefile::AddDefinition
                  ((this->super_cmCommand).Makefile,&local_370.String,local_448._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_448._M_dataplus._M_p != &local_448.field_2) {
          operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
        }
      }
      cmELF::~cmELF((cmELF *)local_208);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"READ_ELF given FILE \"",0x15);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_208,local_3e8.String._M_dataplus._M_p,
                          local_3e8.String._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" that does not exist.",0x16);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_448);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
      std::ios_base::~ios_base(local_198);
    }
    local_90.super_cmCommandArgument._vptr_cmCommandArgument =
         (_func_int **)&PTR__cmCAString_005ebcb0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.String._M_dataplus._M_p != &local_90.String.field_2) {
      operator_delete(local_90.String._M_dataplus._M_p,
                      local_90.String.field_2._M_allocated_capacity + 1);
    }
    local_90.super_cmCommandArgument._vptr_cmCommandArgument =
         (_func_int **)&PTR__cmCommandArgument_005e6578;
    std::
    _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
    ::~_Rb_tree(&local_90.super_cmCommandArgument.ArgumentsBefore._M_t);
    local_370.super_cmCommandArgument._vptr_cmCommandArgument =
         (_func_int **)&PTR__cmCAString_005ebcb0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370.String._M_dataplus._M_p != &local_370.String.field_2) {
      operator_delete(local_370.String._M_dataplus._M_p,
                      local_370.String.field_2._M_allocated_capacity + 1);
    }
    local_370.super_cmCommandArgument._vptr_cmCommandArgument =
         (_func_int **)&PTR__cmCommandArgument_005e6578;
    std::
    _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
    ::~_Rb_tree(&local_370.super_cmCommandArgument.ArgumentsBefore._M_t);
    local_2f8.super_cmCommandArgument._vptr_cmCommandArgument =
         (_func_int **)&PTR__cmCAString_005ebcb0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.String._M_dataplus._M_p != &local_2f8.String.field_2) {
      operator_delete(local_2f8.String._M_dataplus._M_p,
                      local_2f8.String.field_2._M_allocated_capacity + 1);
    }
    local_2f8.super_cmCommandArgument._vptr_cmCommandArgument =
         (_func_int **)&PTR__cmCommandArgument_005e6578;
    std::
    _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
    ::~_Rb_tree(&local_2f8.super_cmCommandArgument.ArgumentsBefore._M_t);
    local_3e8.super_cmCommandArgument._vptr_cmCommandArgument =
         (_func_int **)&PTR__cmCAString_005ebcb0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8.String._M_dataplus._M_p != &local_3e8.String.field_2) {
      operator_delete(local_3e8.String._M_dataplus._M_p,
                      local_3e8.String.field_2._M_allocated_capacity + 1);
    }
    local_3e8.super_cmCommandArgument._vptr_cmCommandArgument =
         (_func_int **)&PTR__cmCommandArgument_005e6578;
    std::
    _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
    ::~_Rb_tree(&local_3e8.super_cmCommandArgument.ArgumentsBefore._M_t);
    local_280.super_cmCommandArgument._vptr_cmCommandArgument =
         (_func_int **)&PTR__cmCAString_005ebcb0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280.String._M_dataplus._M_p != &local_280.String.field_2) {
      operator_delete(local_280.String._M_dataplus._M_p,
                      local_280.String.field_2._M_allocated_capacity + 1);
    }
    local_280.super_cmCommandArgument._vptr_cmCommandArgument =
         (_func_int **)&PTR__cmCommandArgument_005e6578;
    std::
    _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
    ::~_Rb_tree(&local_280.super_cmCommandArgument.ArgumentsBefore._M_t);
    if (local_428.ContainedArguments.
        super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_428.ContainedArguments.
                      super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_428.ContainedArguments.
                            super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_428.ContainedArguments.
                            super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_408.Arguments.
        super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_408.Arguments.
                      super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_408.Arguments.
                            super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_408.Arguments.
                            super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return bVar2;
}

Assistant:

bool cmFileCommand::HandleReadElfCommand(std::vector<std::string> const& args)
{
  if (args.size() < 4) {
    this->SetError("READ_ELF must be called with at least three additional "
                   "arguments.");
    return false;
  }

  cmCommandArgumentsHelper argHelper;
  cmCommandArgumentGroup group;

  cmCAString readArg(&argHelper, "READ_ELF");
  cmCAString fileNameArg(&argHelper, nullptr);

  cmCAString rpathArg(&argHelper, "RPATH", &group);
  cmCAString runpathArg(&argHelper, "RUNPATH", &group);
  cmCAString errorArg(&argHelper, "CAPTURE_ERROR", &group);

  readArg.Follows(nullptr);
  fileNameArg.Follows(&readArg);
  group.Follows(&fileNameArg);
  argHelper.Parse(&args, nullptr);

  if (!cmSystemTools::FileExists(fileNameArg.GetString(), true)) {
    std::ostringstream e;
    e << "READ_ELF given FILE \"" << fileNameArg.GetString()
      << "\" that does not exist.";
    this->SetError(e.str());
    return false;
  }

#if defined(CMAKE_USE_ELF_PARSER)
  cmELF elf(fileNameArg.GetCString());

  if (!rpathArg.GetString().empty()) {
    if (cmELF::StringEntry const* se_rpath = elf.GetRPath()) {
      std::string rpath(se_rpath->Value);
      std::replace(rpath.begin(), rpath.end(), ':', ';');
      this->Makefile->AddDefinition(rpathArg.GetString(), rpath.c_str());
    }
  }
  if (!runpathArg.GetString().empty()) {
    if (cmELF::StringEntry const* se_runpath = elf.GetRunPath()) {
      std::string runpath(se_runpath->Value);
      std::replace(runpath.begin(), runpath.end(), ':', ';');
      this->Makefile->AddDefinition(runpathArg.GetString(), runpath.c_str());
    }
  }

  return true;
#else
  std::string error = "ELF parser not available on this platform.";
  if (errorArg.GetString().empty()) {
    this->SetError(error);
    return false;
  }
  this->Makefile->AddDefinition(errorArg.GetString(), error.c_str());
  return true;
#endif
}